

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O1

bool __thiscall CS248::Shader::createVertexShader(Shader *this,string *filename)

{
  bool bVar1;
  ostream *poVar2;
  string contents;
  string local_38;
  
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  bVar1 = prepareSourceCode(this,filename,&local_38);
  if (bVar1) {
    bVar1 = GLResourceManager::createVertexShader
                      (this->gl_mgr_,local_38._M_dataplus._M_p,&this->vertexShaderId_);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Failed to read ",0xf);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(filename->_M_dataplus)._M_p,
                        filename->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    bVar1 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return bVar1;
}

Assistant:

bool Shader::createVertexShader(const std::string& filename) {
  std::string contents;
  if (!prepareSourceCode(filename, &contents)) {
    cerr << "Failed to read " << filename << endl;
    return false;
  }
  const char* source = contents.c_str();
  if (!gl_mgr_->createVertexShader(source, &vertexShaderId_)) {
    return false;
  }
  return true;
}